

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_node_main.c
# Opt level: O0

apx_error_t start_json_message_server(void)

{
  int iVar1;
  apx_error_t aVar2;
  char *__s;
  size_t sVar3;
  char *bind_address;
  
  __s = (char *)adt_str_cstr(m_bind_address);
  switch(m_bind_resource_type) {
  case '\0':
    bind_address._4_4_ = 1;
    break;
  case '\x01':
  case '\x02':
    bind_address._4_4_ = json_server_start_tcp(__s,m_bind_port);
    break;
  case '\x03':
    bind_address._4_4_ = json_server_start_unix(__s);
    break;
  case '\x04':
    sVar3 = strlen(__s);
    if ((sVar3 == 0) || (iVar1 = strcmp(__s,"localhost"), iVar1 == 0)) {
      aVar2 = json_server_start_tcp("127.0.0.1",m_bind_port);
      return aVar2;
    }
  default:
    bind_address._4_4_ = 1;
  }
  return bind_address._4_4_;
}

Assistant:

static apx_error_t start_json_message_server(void)
{
   const char *bind_address = adt_str_cstr(m_bind_address);
   switch(m_bind_resource_type)
   {
   case APX_RESOURCE_TYPE_UNKNOWN:
      return APX_INVALID_ARGUMENT_ERROR;
   case APX_RESOURCE_TYPE_IPV4: //fall-through
   case APX_RESOURCE_TYPE_IPV6:
      return json_server_start_tcp(bind_address, m_bind_port);
   case APX_RESOURCE_TYPE_FILE:
#ifdef _WIN32
      printf("UNIX domain sockets not supported in Windows\n");
      return APX_NOT_IMPLEMENTED_ERROR;
#else
      return json_server_start_unix(bind_address);
#endif
   case APX_RESOURCE_TYPE_NAME:
      if ( (strlen(bind_address) == 0) || (strcmp(bind_address, "localhost") == 0) )
      {
         return json_server_start_tcp("127.0.0.1", m_bind_port);
      }
   }
   return APX_INVALID_ARGUMENT_ERROR;
}